

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dijkstra.h
# Opt level: O3

void search_min_f_dijkstra
               (vector<int,_std::allocator<int>_> *array,
               vector<bool,_std::allocator<bool>_> *conditional,int from,int to,int *min_dist)

{
  pointer ptVar1;
  uint uVar2;
  int iVar3;
  ulong uVar4;
  int *extraout_RDX;
  int iVar5;
  pointer ptVar6;
  int iVar7;
  vector<int,_std::allocator<int>_> *pvVar8;
  int iVar9;
  int iStack_a0;
  int iStack_9c;
  thread tStack_98;
  vector<std::thread,_std::allocator<std::thread>_> vStack_90;
  vector<bool,_std::allocator<bool>_> *pvStack_70;
  int *piStack_68;
  reference_wrapper<int> rStack_60;
  reference_wrapper<std::vector<bool,_std::allocator<bool>_>_> rStack_58;
  reference_wrapper<std::vector<int,_std::allocator<int>_>_> rStack_50;
  int *piStack_48;
  
  iVar7 = 999999;
  if (from <= to) {
    conditional = (vector<bool,_std::allocator<bool>_> *)
                  (conditional->super__Bvector_base<std::allocator<bool>_>)._M_impl.
                  super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p;
    uVar4 = (ulong)from;
    do {
      iVar5 = (array->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data
              ._M_start[uVar4];
      if (iVar5 < iVar7) {
        iVar9 = (int)uVar4;
        iVar3 = iVar9 + 0x3f;
        if (-1 < iVar9) {
          iVar3 = iVar9;
        }
        if ((*(ulong *)((long)conditional +
                       (ulong)((uVar4 & 0x800000000000003f) < 0x8000000000000001) * 8 +
                       (long)(iVar3 >> 6) * 8 + -8) >> (uVar4 & 0x3f) & 1) == 0) {
          iVar7 = iVar5;
        }
      }
      uVar4 = uVar4 + 1;
    } while (to + 1 != (int)uVar4);
  }
  uVar2 = pthread_mutex_lock((pthread_mutex_t *)&dijkstra_min_dist);
  if (uVar2 != 0) {
    pvVar8 = (vector<int,_std::allocator<int>_> *)(ulong)uVar2;
    std::__throw_system_error(uVar2);
    vStack_90.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    vStack_90.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    vStack_90.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    iVar7 = (int)((ulong)((long)(pvVar8->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                                super__Vector_impl_data._M_finish -
                         (long)(pvVar8->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                               super__Vector_impl_data._M_start) >> 5);
    iVar5 = 8;
    iVar9 = 0;
    pvStack_70 = conditional;
    piStack_68 = extraout_RDX;
    piStack_48 = min_dist;
    while( true ) {
      iVar3 = iVar7 + iVar9;
      iStack_a0 = (int)((ulong)((long)(pvVar8->super__Vector_base<int,_std::allocator<int>_>).
                                      _M_impl.super__Vector_impl_data._M_finish -
                               (long)(pvVar8->super__Vector_base<int,_std::allocator<int>_>)._M_impl
                                     .super__Vector_impl_data._M_start) >> 2) + -1;
      if (iVar3 <= iStack_a0) {
        iStack_a0 = iVar3;
      }
      rStack_58._M_data = pvStack_70;
      rStack_60._M_data = piStack_68;
      iStack_9c = iVar9;
      rStack_50._M_data = pvVar8;
      std::thread::
      thread<void(&)(std::vector<int,std::allocator<int>>&,std::vector<bool,std::allocator<bool>>&,int,int,int&),std::reference_wrapper<std::vector<int,std::allocator<int>>>,std::reference_wrapper<std::vector<bool,std::allocator<bool>>>,int&,int&,std::reference_wrapper<int>,void>
                (&tStack_98,search_min_f_dijkstra,&rStack_50,&rStack_58,&iStack_9c,&iStack_a0,
                 &rStack_60);
      std::vector<std::thread,_std::allocator<std::thread>_>::emplace_back<std::thread>
                (&vStack_90,&tStack_98);
      ptVar1 = vStack_90.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
               super__Vector_impl_data._M_finish;
      if (tStack_98._M_id._M_thread != 0) break;
      iVar9 = iVar9 + iVar7 + 1;
      iVar5 = iVar5 + -1;
      ptVar6 = vStack_90.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
               super__Vector_impl_data._M_start;
      if (iVar5 == 0) {
        for (; ptVar6 != ptVar1; ptVar6 = ptVar6 + 1) {
          if ((ptVar6->_M_id)._M_thread != 0) {
            std::thread::join();
          }
        }
        std::vector<std::thread,_std::allocator<std::thread>_>::~vector(&vStack_90);
        return;
      }
    }
    std::terminate();
  }
  if (iVar7 < *min_dist) {
    *min_dist = iVar7;
  }
  pthread_mutex_unlock((pthread_mutex_t *)&dijkstra_min_dist);
  return;
}

Assistant:

void search_min_f_dijkstra(vector<int>& array, vector<bool>& conditional, int from, int to, int& min_dist){
    int local_min = MAX_INT;
    for (int i=from; i<=to; i++){
        if (array[i] < local_min && !conditional[i]){
            local_min = array[i];
        }
    }
    dijkstra_min_dist.lock();
    if (local_min < min_dist){
        min_dist = local_min;
    }
    dijkstra_min_dist.unlock();
}